

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::Scene::visualizeShadowMap(Scene *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Shader *pSVar2;
  socklen_t in_ECX;
  sockaddr *__addr;
  string local_48;
  undefined1 local_28 [8];
  _Alloc_hider local_20;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"pre viz shadow map","");
  checkGLError(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  GLResourceManager::bindVertexArray
            ((GLResourceManager *)&local_20,(VertexArrayId)(GLuint)this->gl_mgr_);
  Shader::bind((Shader *)local_28,(int)this->shadowVizShader_,__addr,in_ECX);
  pSVar2 = this->shadowVizShader_;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"vtx_position","");
  Shader::setVertexBuffer(pSVar2,&local_48,3,(VertexBufferId)(this->shadowVizVtxBufferId_).id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pSVar2 = this->shadowVizShader_;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"vtx_texcoord","");
  Shader::setVertexBuffer(pSVar2,&local_48,2,(VertexBufferId)(this->shadowVizTexCoordBufferId_).id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pSVar2 = this->shadowVizShader_;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"depthTextureArray","");
  Shader::setTextureArraySampler
            (pSVar2,&local_48,(TextureArrayId)(this->shadowDepthTextureArrayId_).id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pSVar2 = this->shadowVizShader_;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"colorTextureArray","");
  Shader::setTextureArraySampler
            (pSVar2,&local_48,(TextureArrayId)(this->shadowColorTextureArrayId_).id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"before glDrawArrays for shadow viz","");
  checkGLError(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  glDrawArrays(4,0,6);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"post viz shadow map","");
  checkGLError(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_28 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  if ((long *)local_20._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_20._M_p + 8))();
  }
  return;
}

Assistant:

void Scene::visualizeShadowMap() {
    checkGLError("pre viz shadow map");

    auto vertex_array_bind = gl_mgr_->bindVertexArray(shadowVizVertexArrayId_);
    auto shader_bind = shadowVizShader_->bind();
    shadowVizShader_->setVertexBuffer("vtx_position", 3, shadowVizVtxBufferId_);
    shadowVizShader_->setVertexBuffer("vtx_texcoord", 2, shadowVizTexCoordBufferId_);
    shadowVizShader_->setTextureArraySampler("depthTextureArray", shadowDepthTextureArrayId_);
    shadowVizShader_->setTextureArraySampler("colorTextureArray", shadowColorTextureArrayId_);
    // now issue the draw command to OpenGL
    checkGLError("before glDrawArrays for shadow viz");
    // 6 indices, 2 triangles to render
    glDrawArrays(GL_TRIANGLES, /*first=*/0, /*count=*/6);

    checkGLError("post viz shadow map");
}